

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O2

word zzSub(word *c,word *a,word *b,size_t n)

{
  word wVar1;
  ulong uVar2;
  size_t sVar3;
  
  wVar1 = 0;
  for (sVar3 = 0; n != sVar3; sVar3 = sVar3 + 1) {
    uVar2 = wVar1 + b[sVar3];
    wVar1 = (word)(a[sVar3] < uVar2 || CARRY8(wVar1,b[sVar3]));
    c[sVar3] = a[sVar3] - uVar2;
  }
  return wVar1;
}

Assistant:

word zzSub(word c[], const word a[], const word b[], size_t n)
{
	register word borrow = 0;
	register word w;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	for (i = 0; i < n; ++i)
	{
#ifndef SAFE_FAST
		w = b[i] + borrow;
		borrow = wordLess01(w, borrow);
		borrow |= wordLess01(a[i], w);
		c[i] = a[i] - w;
#else
		w = a[i] - borrow;
		if (w > (word)~borrow)
			c[i] = ~b[i];
		else
			w -= b[i], borrow = w > (word)~b[i], c[i] = w;
#endif
	}
	w = 0;
	return borrow;
}